

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::allocateMetadata(IsoWriter *this)

{
  FileEntryInfo *this_00;
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  runtime_error *this_01;
  char *value;
  size_type sVar4;
  reference ppVar5;
  ulong uVar6;
  size_t __n;
  pair<const_int,_MappingEntry> *mappingEntry;
  iterator __end1;
  iterator __begin1;
  map<int,_MappingEntry,_std::less<int>,_std::allocator<std::pair<const_int,_MappingEntry>_>_>
  *__range1;
  ByteFileWriter writer;
  uint8_t *buffer;
  int sectorNum;
  IsoWriter *this_local;
  
  iVar3 = allocateEntity(this,this->m_rootDirInfo,2);
  this->m_systemStreamLBN = iVar3;
  allocateEntity(this,this->m_systemStreamDir,this->m_systemStreamLBN);
  uVar6 = (long)this->m_metadataFileLen / 0x800;
  __n = uVar6 & 0xffffffff;
  if ((int)uVar6 < this->m_systemStreamLBN + 3) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,
               "ISO error: Not enough space in metadata partition. It possible in a split mode if a lot of files. Please provide addition input parameter --extra-iso-space to increate metadata space. Default value for this parameter in split mode: 4"
              );
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  File::seek(&this->m_file,(long)this->m_metadataFileLen + 0xa0000,smBegin);
  writer.m_tagPos = (uint8_t *)operator_new__(0x10000);
  memset(writer.m_tagPos,0,0x10000);
  ByteFileWriter::ByteFileWriter((ByteFileWriter *)&__range1);
  ByteFileWriter::setBuffer((ByteFileWriter *)&__range1,writer.m_tagPos,0x10000);
  value = (char *)std::__cxx11::string::c_str();
  ByteFileWriter::writeCharSpecString((ByteFileWriter *)&__range1,value,0x20);
  ByteFileWriter::writeLE32((ByteFileWriter *)&__range1,0);
  sVar4 = std::
          map<int,_MappingEntry,_std::less<int>,_std::allocator<std::pair<const_int,_MappingEntry>_>_>
          ::size(&this->m_mappingEntries);
  ByteFileWriter::writeLE32((ByteFileWriter *)&__range1,(uint)sVar4 & 0xffff);
  ByteFileWriter::writeLE32((ByteFileWriter *)&__range1,0);
  ByteFileWriter::writeLE32((ByteFileWriter *)&__range1,0);
  __end1 = std::
           map<int,_MappingEntry,_std::less<int>,_std::allocator<std::pair<const_int,_MappingEntry>_>_>
           ::begin(&this->m_mappingEntries);
  mappingEntry = (pair<const_int,_MappingEntry> *)
                 std::
                 map<int,_MappingEntry,_std::less<int>,_std::allocator<std::pair<const_int,_MappingEntry>_>_>
                 ::end(&this->m_mappingEntries);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&mappingEntry);
    puVar1 = writer.m_tagPos;
    if (!bVar2) break;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_MappingEntry>_>::operator*(&__end1);
    ByteFileWriter::writeLE32((ByteFileWriter *)&__range1,ppVar5->first);
    ByteFileWriter::writeLE32((ByteFileWriter *)&__range1,(ppVar5->second).parentLBN);
    ByteFileWriter::writeLE32((ByteFileWriter *)&__range1,(ppVar5->second).LBN);
    ByteFileWriter::writeLE16((ByteFileWriter *)&__range1,1);
    ByteFileWriter::writeLE16((ByteFileWriter *)&__range1,1);
    std::_Rb_tree_iterator<std::pair<const_int,_MappingEntry>_>::operator++(&__end1);
  }
  this_00 = this->m_metadataMappingFile;
  uVar6 = ByteFileWriter::size((ByteFileWriter *)&__range1);
  iVar3 = (int)puVar1;
  FileEntryInfo::write(this_00,iVar3,(void *)(uVar6 & 0xffffffff),__n);
  FileEntryInfo::close(this->m_metadataMappingFile,iVar3);
  if (writer.m_tagPos != (uint8_t *)0x0) {
    operator_delete__(writer.m_tagPos);
  }
  return;
}

Assistant:

void IsoWriter::allocateMetadata()
{
    constexpr int sectorNum = 2;  // reserve sector for file set descriptor and terminating descriptor
    m_systemStreamLBN = allocateEntity(m_rootDirInfo, sectorNum);
    allocateEntity(m_systemStreamDir, m_systemStreamLBN);

    if (m_systemStreamLBN + 3 > m_metadataFileLen / SECTOR_SIZE)
        throw std::runtime_error(
            "ISO error: Not enough space in metadata partition. It possible in a split mode if a lot of files. Please "
            "provide addition input parameter --extra-iso-space to increate metadata space. Default value for this "
            "parameter in split mode: 4");

    // write udf unique id mapping file
    m_file.seek(static_cast<int64_t>(METADATA_START_ADDR) * SECTOR_SIZE + m_metadataFileLen);

    const auto buffer = new uint8_t[ALLOC_BLOCK_SIZE];
    memset(buffer, 0, ALLOC_BLOCK_SIZE);
    ByteFileWriter writer;
    writer.setBuffer(buffer, ALLOC_BLOCK_SIZE);

    writer.writeCharSpecString(m_impId.c_str(), 32);
    writer.writeLE32(0);  // flags
    writer.writeLE32(static_cast<uint16_t>(m_mappingEntries.size()));
    writer.writeLE32(0);  // reserved
    writer.writeLE32(0);  // reserved

    for (const auto &mappingEntry : m_mappingEntries)
    {
        writer.writeLE32(mappingEntry.first);  // unique ID
        writer.writeLE32(mappingEntry.second.parentLBN);
        writer.writeLE32(mappingEntry.second.LBN);
        writer.writeLE16(1);  // parent partition
        writer.writeLE16(1);  // object partition
    }

    m_metadataMappingFile->write(buffer, static_cast<int32_t>(writer.size()));
    m_metadataMappingFile->close();
    delete[] buffer;
}